

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

measurement units::measurement_cast_from_string(string *measurement_string,uint64_t match_flags)

{
  measurement mVar1;
  uint64_t in_stack_00000168;
  string *in_stack_00000170;
  precise_measurement *measure;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  measure = (precise_measurement *)&stack0xffffffffffffffa8;
  std::__cxx11::string::string(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  measurement_from_string(in_stack_00000170,in_stack_00000168);
  mVar1 = measurement_cast(measure);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)mVar1.units_);
  return mVar1;
}

Assistant:

inline measurement measurement_cast_from_string(
    std::string measurement_string,
    std::uint64_t match_flags = getDefaultFlags())
{
    return measurement_cast(
        measurement_from_string(std::move(measurement_string), match_flags));
}